

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 djb::brdf::u2_to_d2(vec2 *u)

{
  float_t fVar1;
  float fVar2;
  float_t fVar3;
  double dVar4;
  double dVar5;
  vec2 vVar6;
  vec2 local_30;
  float_t local_28;
  float local_24;
  float_t r;
  float_t phi;
  float_t r2;
  float_t r1;
  vec2 *u_local;
  
  phi = u->x + u->x + -1.0;
  r = u->y + u->y + -1.0;
  _r2 = u;
  if ((((phi != 0.0) || (NAN(phi))) || (r != 0.0)) || (NAN(r))) {
    if (phi * phi <= r * r) {
      local_28 = r;
      fVar1 = m_pi();
      fVar2 = phi / r;
      fVar3 = m_pi();
      local_24 = -fVar2 * (fVar3 / 4.0) + fVar1 / 2.0;
    }
    else {
      local_28 = phi;
      fVar1 = m_pi();
      local_24 = (fVar1 / 4.0) * (r / phi);
    }
  }
  else {
    local_24 = 0.0;
    local_28 = 0.0;
  }
  fVar1 = local_28;
  dVar4 = std::cos((double)(ulong)(uint)local_24);
  dVar5 = std::sin((double)(ulong)(uint)local_24);
  vec2::vec2(&local_30,SUB84(dVar4,0),SUB84(dVar5,0));
  vVar6 = djb::operator*(fVar1,&local_30);
  return vVar6;
}

Assistant:

vec2 brdf::u2_to_d2(const vec2 &u)
{
	/* Concentric map code with less branching (by Dave Cline), see
	   http://psgraphics.blogspot.ch/2011/01/improved-code-for-concentric-map.html */
	float_t r1 = 2 * u.x - 1;
	float_t r2 = 2 * u.y - 1;
	float_t phi, r;

	if (r1 == 0 && r2 == 0) {
		r = phi = 0;
	} else if (r1 * r1 > r2 * r2) {
		r = r1;
		phi = (m_pi() / 4) * (r2 / r1);
	} else {
		r = r2;
		phi = (m_pi() / 2) - (r1 / r2) * (m_pi() / 4);
	}

	return r * vec2(cos(phi), sin(phi));
}